

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O1

string * __thiscall
mtmd_context::token_to_piece_abi_cxx11_
          (string *__return_storage_ptr__,mtmd_context *this,llama_vocab *vocab,llama_token token,
          bool special)

{
  int iVar1;
  int iVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,'\x0f');
  iVar1 = llama_token_to_piece
                    (vocab,token,(__return_storage_ptr__->_M_dataplus)._M_p,
                     (int)__return_storage_ptr__->_M_string_length,0,special);
  if (iVar1 < 0) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)-iVar1);
    iVar2 = llama_token_to_piece
                      (vocab,token,(__return_storage_ptr__->_M_dataplus)._M_p,
                       (int)__return_storage_ptr__->_M_string_length,0,special);
    if (iVar2 != -iVar1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/mtmd.cpp"
                 ,0x72,"GGML_ASSERT(%s) failed","check == -n_chars");
    }
  }
  else {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)iVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string token_to_piece(const llama_vocab * vocab, llama_token token, bool special) {
        std::string piece;
        piece.resize(piece.capacity());  // using string internal cache, 15 bytes + '\n'
        const int n_chars = llama_token_to_piece(vocab, token, &piece[0], piece.size(), 0, special);
        if (n_chars < 0) {
            piece.resize(-n_chars);
            int check = llama_token_to_piece(vocab, token, &piece[0], piece.size(), 0, special);
            GGML_ASSERT(check == -n_chars);
        } else {
            piece.resize(n_chars);
        }
        return piece;
    }